

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::ResultOfMatcher<int(int),int>::operator()
          (AssertionResult *__return_storage_ptr__,ResultOfMatcher<int(int),int> *this,int *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int *local_20;
  int *actual_local;
  ResultOfMatcher<int_(int),_int> *this_local;
  
  local_20 = actual;
  actual_local = (int *)this;
  this_local = (ResultOfMatcher<int_(int),_int> *)__return_storage_ptr__;
  bVar1 = ResultOfMatcher<int_(int),_int>::Check<int>
                    ((ResultOfMatcher<int_(int),_int> *)this,actual);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }